

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  long lVar1;
  long lVar2;
  float fVar3;
  Scalar *pSVar4;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar5;
  Scalar *pSVar6;
  ostream *poVar7;
  double dVar8;
  MeasurementPackage local_100;
  MeasurementPackage local_e0;
  undefined8 local_c0;
  double dt_eps;
  double dt;
  Scalar local_a8;
  Scalar local_a0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68 [3];
  double local_50;
  double local_48;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_40;
  float local_20;
  float local_1c;
  float phi;
  float rho;
  MeasurementPackage *meas_package_local;
  UKF *this_local;
  
  _phi = meas_package;
  meas_package_local = (MeasurementPackage *)this;
  if ((this->is_initialized_ & 1U) == 0) {
    this->time_us_ = meas_package->timestamp_;
    if (meas_package->sensor_type_ == RADAR) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &meas_package->raw_measurements_,0);
      local_1c = (float)*pSVar4;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &meas_package->raw_measurements_,1);
      fVar3 = local_1c;
      local_20 = (float)*pSVar4;
      dVar8 = std::cos((double)(ulong)(uint)local_20);
      local_48 = (double)(fVar3 * SUB84(dVar8,0));
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_40,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,&local_48
                );
      fVar3 = local_1c;
      dVar8 = std::sin((double)(ulong)(uint)local_20);
      local_50 = (double)(fVar3 * SUB84(dVar8,0));
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_40,&local_50);
      local_68[0] = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar5,local_68);
      local_70 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar5,&local_70);
      local_78 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar5,&local_78);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_40)
      ;
    }
    else if (meas_package->sensor_type_ == LASER) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &meas_package->raw_measurements_,0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_98,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,pSVar4);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &meas_package->raw_measurements_,1);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_98,pSVar4);
      local_a0 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar5,&local_a0);
      local_a8 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar5,&local_a8);
      dt = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar5,&dt);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_98)
      ;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&this->P_,
                          0,0);
      *pSVar6 = 0.5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&this->P_,
                          1,1);
      *pSVar6 = 0.5;
    }
    this->is_initialized_ = true;
  }
  else {
    lVar1 = meas_package->timestamp_;
    lVar2 = this->time_us_;
    this->time_us_ = meas_package->timestamp_;
    for (dt_eps = (double)(lVar1 - lVar2) / 1000000.0; 0.1 < dt_eps; dt_eps = dt_eps - 0.05) {
      local_c0 = 0x3fa999999999999a;
      Prediction(this,0.05);
    }
    Prediction(this,dt_eps);
    if (meas_package->sensor_type_ == RADAR) {
      MeasurementPackage::MeasurementPackage(&local_e0,meas_package);
      UpdateRadar(this,&local_e0);
      MeasurementPackage::~MeasurementPackage(&local_e0);
    }
    else if (meas_package->sensor_type_ == LASER) {
      MeasurementPackage::MeasurementPackage(&local_100,meas_package);
      UpdateLidar(this,&local_100);
      MeasurementPackage::~MeasurementPackage(&local_100);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"x_ = ");
    poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &this->x_);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cout,"P_ = ");
    poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      &this->P_);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void UKF::ProcessMeasurement(MeasurementPackage meas_package) {
  /**
  TODO:

  Complete this function! Make sure you switch between lidar and radar
  measurements.
  */

  if (!is_initialized_){
    time_us_ = meas_package.timestamp_;
    if (meas_package.sensor_type_ == MeasurementPackage::RADAR){
      float rho = meas_package.raw_measurements_[0];
      float phi = meas_package.raw_measurements_[1];
      x_ << rho*cos(phi), rho*sin(phi), 0, 0, 0;
    }
    else if (meas_package.sensor_type_ == MeasurementPackage::LASER){
      x_ << meas_package.raw_measurements_[0],
            meas_package.raw_measurements_[1],
            0, 0, 0;
      // use smaller variance for lidar
      P_(0,0) = 0.5;
      P_(1,1) = 0.5;
    }
    is_initialized_ = true;
    return;
  }

  //compute the time elapsed between the current and previous measurements
  double dt = (double)(meas_package.timestamp_ - time_us_) / 1000000.0;	//dt - expressed in seconds
  time_us_ = meas_package.timestamp_;

  // predict state vector

  // for large time intervals (dataset-2), Eulers approx for integration fails
  // one solution is to use smaller time intervals
  while(dt > 0.1){
    const double dt_eps = 0.05;
    Prediction(dt_eps);
    dt -= dt_eps;
  }
  Prediction(dt);

  // update state vector
  if (meas_package.sensor_type_ == MeasurementPackage::RADAR){
    UpdateRadar(meas_package);
  }
  else if (meas_package.sensor_type_ == MeasurementPackage::LASER){
    UpdateLidar(meas_package);
  }

  // print the output
  cout << "x_ = " << x_ << endl;
  cout << "P_ = " << P_ << endl;
}